

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fifteen.cpp
# Opt level: O3

void __thiscall Fifteen::initGame(Fifteen *this)

{
  _Rb_tree_header *p_Var1;
  Controller *__ptr;
  TilesBoard *__ptr_00;
  MenuBar *pMVar2;
  pointer __p_1;
  Controller *this_00;
  TilesBoard *this_01;
  pointer __p_00;
  pointer __p_01;
  QVBoxLayout *pQVar3;
  QWidget *pQVar4;
  QHBoxLayout *this_02;
  QGroupBox *pQVar5;
  _Any_data *p_Var6;
  pointer __p;
  long lVar7;
  QByteArrayView QVar8;
  QByteArrayView QVar9;
  QByteArrayView QVar10;
  QByteArrayView QVar11;
  QByteArrayView QVar12;
  QByteArrayView QVar13;
  QString local_178;
  _Any_data local_158;
  code *local_148;
  code *pcStack_140;
  undefined8 *local_138;
  undefined8 uStack_130;
  code *local_128;
  code *pcStack_120;
  _Any_data local_118;
  code *local_108 [3];
  _Any_data local_f0;
  code *local_e0;
  code *local_d8;
  _Any_data local_d0;
  code *local_c0;
  code *local_b8;
  _Any_data local_b0;
  code *local_a0;
  code *local_98;
  _Any_data local_90;
  code *local_80;
  code *local_78;
  _Any_data local_70;
  code *local_60;
  code *local_58;
  _Any_data local_50;
  code *local_40;
  code *local_38;
  
  local_158._M_unused._M_object = (void *)0x25800000352;
  QWidget::resize((QSize *)this);
  this_00 = (Controller *)operator_new(0x18);
  Controller::Controller(this_00);
  local_158._M_unused._M_object = (Controller *)0x0;
  __ptr = (this->controller)._M_t.
          super___uniq_ptr_impl<Controller,_std::default_delete<Controller>_>._M_t.
          super__Tuple_impl<0UL,_Controller_*,_std::default_delete<Controller>_>.
          super__Head_base<0UL,_Controller_*,_false>._M_head_impl;
  (this->controller)._M_t.super___uniq_ptr_impl<Controller,_std::default_delete<Controller>_>._M_t.
  super__Tuple_impl<0UL,_Controller_*,_std::default_delete<Controller>_>.
  super__Head_base<0UL,_Controller_*,_false>._M_head_impl = this_00;
  if (__ptr != (Controller *)0x0) {
    std::default_delete<Controller>::operator()
              ((default_delete<Controller> *)&this->controller,__ptr);
    if ((Controller *)local_158._M_unused._0_8_ != (Controller *)0x0) {
      std::default_delete<Controller>::operator()
                ((default_delete<Controller> *)local_158._M_pod_data,
                 (Controller *)local_158._M_unused._0_8_);
    }
  }
  this_01 = (TilesBoard *)operator_new(0x58);
  local_158._M_unused._M_object = (void *)0x0;
  local_158._8_8_ = (char16_t *)0x0;
  local_148 = (code *)0x0;
  pcStack_140 = (code *)0x0;
  local_158._M_unused._M_object = operator_new(0x18);
  *(code **)local_158._M_unused._0_8_ = pressTile;
  *(undefined8 *)((long)local_158._M_unused._0_8_ + 8) = 0;
  *(Fifteen **)((long)local_158._M_unused._0_8_ + 0x10) = this;
  pcStack_140 = std::_Function_handler<void_(),_std::_Bind<void_(Fifteen::*(Fifteen_*))()>_>::
                _M_invoke;
  local_148 = std::_Function_handler<void_(),_std::_Bind<void_(Fifteen::*(Fifteen_*))()>_>::
              _M_manager;
  TilesBoard::TilesBoard(this_01,(function<void_()> *)&local_158);
  if (local_148 != (code *)0x0) {
    local_178.d.d = (Data *)this_01;
    (*local_148)(&local_158,&local_158,__destroy_functor);
    this_01 = (TilesBoard *)local_178.d.d;
  }
  local_178.d.d = (Data *)0x0;
  __ptr_00 = (this->tilesBoard)._M_t.
             super___uniq_ptr_impl<TilesBoard,_std::default_delete<TilesBoard>_>._M_t.
             super__Tuple_impl<0UL,_TilesBoard_*,_std::default_delete<TilesBoard>_>.
             super__Head_base<0UL,_TilesBoard_*,_false>._M_head_impl;
  (this->tilesBoard)._M_t.super___uniq_ptr_impl<TilesBoard,_std::default_delete<TilesBoard>_>._M_t.
  super__Tuple_impl<0UL,_TilesBoard_*,_std::default_delete<TilesBoard>_>.
  super__Head_base<0UL,_TilesBoard_*,_false>._M_head_impl = this_01;
  if (__ptr_00 != (TilesBoard *)0x0) {
    std::default_delete<TilesBoard>::operator()
              ((default_delete<TilesBoard> *)&this->tilesBoard,__ptr_00);
    if ((TilesBoard *)local_178.d.d != (TilesBoard *)0x0) {
      std::default_delete<TilesBoard>::operator()
                ((default_delete<TilesBoard> *)&local_178,(TilesBoard *)local_178.d.d);
    }
  }
  __p_00 = (pointer)operator_new(0x60);
  p_Var1 = &(__p_00->radioSizeMap)._M_t._M_impl.super__Rb_tree_header;
  (__p_00->radioSizeMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (__p_00->radioSizeMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0x0;
  (__p_00->radioSizeMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
  (__p_00->radioSizeMap)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  *(undefined8 *)&(__p_00->radioSizeMap)._M_t._M_impl = 0;
  *(undefined8 *)&(__p_00->radioSizeMap)._M_t._M_impl.super__Rb_tree_header._M_header = 0;
  *(undefined8 *)&(__p_00->radioModeMap)._M_t._M_impl = 0;
  *(undefined8 *)&(__p_00->radioModeMap)._M_t._M_impl.super__Rb_tree_header._M_header = 0;
  (__p_00->radioSizeMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (__p_00->radioSizeMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  p_Var1 = &(__p_00->radioModeMap)._M_t._M_impl.super__Rb_tree_header;
  (__p_00->radioModeMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (__p_00->radioModeMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (__p_00->radioModeMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (__p_00->radioModeMap)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  std::__uniq_ptr_impl<Panel,_std::default_delete<Panel>_>::reset
            ((__uniq_ptr_impl<Panel,_std::default_delete<Panel>_> *)&this->panel,__p_00);
  __p_01 = (pointer)operator_new(0x30);
  p_Var1 = &(__p_01->mapAction)._M_t._M_impl.super__Rb_tree_header;
  (__p_01->mapAction)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (__p_01->mapAction)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0x0;
  *(undefined8 *)&(__p_01->mapAction)._M_t._M_impl = 0;
  *(undefined8 *)&(__p_01->mapAction)._M_t._M_impl.super__Rb_tree_header._M_header = 0;
  (__p_01->mapAction)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (__p_01->mapAction)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (__p_01->mapAction)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_158._M_unused._M_object = (QArrayData *)0x0;
  std::__uniq_ptr_impl<MenuBar,_std::default_delete<MenuBar>_>::reset
            ((__uniq_ptr_impl<MenuBar,_std::default_delete<MenuBar>_> *)&this->menuBar,__p_01);
  std::unique_ptr<MenuBar,_std::default_delete<MenuBar>_>::~unique_ptr
            ((unique_ptr<MenuBar,_std::default_delete<MenuBar>_> *)&local_158);
  pMVar2 = (this->menuBar)._M_t.super___uniq_ptr_impl<MenuBar,_std::default_delete<MenuBar>_>._M_t.
           super__Tuple_impl<0UL,_MenuBar_*,_std::default_delete<MenuBar>_>.
           super__Head_base<0UL,_MenuBar_*,_false>._M_head_impl;
  local_50._8_8_ = 0;
  local_50._M_unused._M_object = operator_new(0x18);
  *(code **)local_50._M_unused._0_8_ = slotLoadGraphic;
  *(undefined8 *)((long)local_50._M_unused._0_8_ + 8) = 0;
  *(Fifteen **)((long)local_50._M_unused._0_8_ + 0x10) = this;
  local_38 = std::_Function_handler<void_(),_std::_Bind<void_(Fifteen::*(Fifteen_*))()>_>::_M_invoke
  ;
  local_40 = std::_Function_handler<void_(),_std::_Bind<void_(Fifteen::*(Fifteen_*))()>_>::
             _M_manager;
  QVar8.m_data = (storage_type *)0x11;
  QVar8.m_size = (qsizetype)&local_158;
  QString::fromUtf8(QVar8);
  local_178.d.d = (Data *)local_158._M_unused._0_8_;
  local_178.d.ptr = (char16_t *)local_158._8_8_;
  local_178.d.size = (qsizetype)local_148;
  MenuBar::bindSlot(pMVar2,OPEN_GRAPHIC,(function<void_()> *)&local_50,&this->super_QMainWindow,
                    &local_178);
  if (&(local_178.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_178.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_178.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_178.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_178.d.d)->super_QArrayData,2,8);
    }
  }
  if (local_40 != (code *)0x0) {
    (*local_40)(&local_50,&local_50,__destroy_functor);
  }
  pMVar2 = (this->menuBar)._M_t.super___uniq_ptr_impl<MenuBar,_std::default_delete<MenuBar>_>._M_t.
           super__Tuple_impl<0UL,_MenuBar_*,_std::default_delete<MenuBar>_>.
           super__Head_base<0UL,_MenuBar_*,_false>._M_head_impl;
  local_70._8_8_ = 0;
  local_70._M_unused._M_object = operator_new(0x18);
  *(code **)local_70._M_unused._0_8_ = slotRemoveGraphic;
  *(undefined8 *)((long)local_70._M_unused._0_8_ + 8) = 0;
  *(Fifteen **)((long)local_70._M_unused._0_8_ + 0x10) = this;
  local_58 = std::_Function_handler<void_(),_std::_Bind<void_(Fifteen::*(Fifteen_*))()>_>::_M_invoke
  ;
  local_60 = std::_Function_handler<void_(),_std::_Bind<void_(Fifteen::*(Fifteen_*))()>_>::
             _M_manager;
  QVar9.m_data = (storage_type *)0xe;
  QVar9.m_size = (qsizetype)&local_158;
  QString::fromUtf8(QVar9);
  local_178.d.d = (Data *)local_158._M_unused._0_8_;
  local_178.d.ptr = (char16_t *)local_158._8_8_;
  local_178.d.size = (qsizetype)local_148;
  MenuBar::bindSlot(pMVar2,REM_GRAPHIC,(function<void_()> *)&local_70,&this->super_QMainWindow,
                    &local_178);
  if (&(local_178.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_178.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_178.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_178.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_178.d.d)->super_QArrayData,2,8);
    }
  }
  if (local_60 != (code *)0x0) {
    (*local_60)(&local_70,&local_70,__destroy_functor);
  }
  pMVar2 = (this->menuBar)._M_t.super___uniq_ptr_impl<MenuBar,_std::default_delete<MenuBar>_>._M_t.
           super__Tuple_impl<0UL,_MenuBar_*,_std::default_delete<MenuBar>_>.
           super__Head_base<0UL,_MenuBar_*,_false>._M_head_impl;
  local_90._8_8_ = 0;
  local_90._M_unused._M_object = operator_new(0x18);
  *(code **)local_90._M_unused._0_8_ = slotSaveBoard;
  *(undefined8 *)((long)local_90._M_unused._0_8_ + 8) = 0;
  *(Fifteen **)((long)local_90._M_unused._0_8_ + 0x10) = this;
  local_78 = std::_Function_handler<void_(),_std::_Bind<void_(Fifteen::*(Fifteen_*))()>_>::_M_invoke
  ;
  local_80 = std::_Function_handler<void_(),_std::_Bind<void_(Fifteen::*(Fifteen_*))()>_>::
             _M_manager;
  QVar10.m_data = (storage_type *)0xa;
  QVar10.m_size = (qsizetype)&local_158;
  QString::fromUtf8(QVar10);
  local_178.d.d = (Data *)local_158._M_unused._0_8_;
  local_178.d.ptr = (char16_t *)local_158._8_8_;
  local_178.d.size = (qsizetype)local_148;
  MenuBar::bindSlot(pMVar2,SAVE_BOARD,(function<void_()> *)&local_90,&this->super_QMainWindow,
                    &local_178);
  if (&(local_178.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_178.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_178.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_178.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_178.d.d)->super_QArrayData,2,8);
    }
  }
  if (local_80 != (code *)0x0) {
    (*local_80)(&local_90,&local_90,__destroy_functor);
  }
  pMVar2 = (this->menuBar)._M_t.super___uniq_ptr_impl<MenuBar,_std::default_delete<MenuBar>_>._M_t.
           super__Tuple_impl<0UL,_MenuBar_*,_std::default_delete<MenuBar>_>.
           super__Head_base<0UL,_MenuBar_*,_false>._M_head_impl;
  local_b0._8_8_ = 0;
  local_b0._M_unused._M_object = operator_new(0x18);
  *(code **)local_b0._M_unused._0_8_ = slotReadBoard;
  *(undefined8 *)((long)local_b0._M_unused._0_8_ + 8) = 0;
  *(Fifteen **)((long)local_b0._M_unused._0_8_ + 0x10) = this;
  local_98 = std::_Function_handler<void_(),_std::_Bind<void_(Fifteen::*(Fifteen_*))()>_>::_M_invoke
  ;
  local_a0 = std::_Function_handler<void_(),_std::_Bind<void_(Fifteen::*(Fifteen_*))()>_>::
             _M_manager;
  QVar11.m_data = (storage_type *)0xa;
  QVar11.m_size = (qsizetype)&local_158;
  QString::fromUtf8(QVar11);
  local_178.d.d = (Data *)local_158._M_unused._0_8_;
  local_178.d.ptr = (char16_t *)local_158._8_8_;
  local_178.d.size = (qsizetype)local_148;
  MenuBar::bindSlot(pMVar2,LOAD_BOARD,(function<void_()> *)&local_b0,&this->super_QMainWindow,
                    &local_178);
  if (&(local_178.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_178.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_178.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_178.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_178.d.d)->super_QArrayData,2,8);
    }
  }
  if (local_a0 != (code *)0x0) {
    (*local_a0)(&local_b0,&local_b0,__destroy_functor);
  }
  pMVar2 = (this->menuBar)._M_t.super___uniq_ptr_impl<MenuBar,_std::default_delete<MenuBar>_>._M_t.
           super__Tuple_impl<0UL,_MenuBar_*,_std::default_delete<MenuBar>_>.
           super__Head_base<0UL,_MenuBar_*,_false>._M_head_impl;
  local_d0._8_8_ = 0;
  local_d0._M_unused._M_object = operator_new(0x18);
  *(code **)local_d0._M_unused._0_8_ = slotSettings;
  *(undefined8 *)((long)local_d0._M_unused._0_8_ + 8) = 0;
  *(Fifteen **)((long)local_d0._M_unused._0_8_ + 0x10) = this;
  local_b8 = std::_Function_handler<void_(),_std::_Bind<void_(Fifteen::*(Fifteen_*))()>_>::_M_invoke
  ;
  local_c0 = std::_Function_handler<void_(),_std::_Bind<void_(Fifteen::*(Fifteen_*))()>_>::
             _M_manager;
  QVar12.m_data = (storage_type *)0x8;
  QVar12.m_size = (qsizetype)&local_158;
  QString::fromUtf8(QVar12);
  local_178.d.d = (Data *)local_158._M_unused._0_8_;
  local_178.d.ptr = (char16_t *)local_158._8_8_;
  local_178.d.size = (qsizetype)local_148;
  MenuBar::bindSlot(pMVar2,SETTINGS,(function<void_()> *)&local_d0,&this->super_QMainWindow,
                    &local_178);
  if (&(local_178.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_178.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_178.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_178.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_178.d.d)->super_QArrayData,2,8);
    }
  }
  if (local_c0 != (code *)0x0) {
    (*local_c0)(&local_d0,&local_d0,__destroy_functor);
  }
  pMVar2 = (this->menuBar)._M_t.super___uniq_ptr_impl<MenuBar,_std::default_delete<MenuBar>_>._M_t.
           super__Tuple_impl<0UL,_MenuBar_*,_std::default_delete<MenuBar>_>.
           super__Head_base<0UL,_MenuBar_*,_false>._M_head_impl;
  local_f0._8_8_ = 0;
  local_f0._M_unused._M_object = operator_new(0x18);
  *(code **)local_f0._M_unused._0_8_ = slotAbout;
  *(undefined8 *)((long)local_f0._M_unused._0_8_ + 8) = 0;
  *(Fifteen **)((long)local_f0._M_unused._0_8_ + 0x10) = this;
  local_d8 = std::_Function_handler<void_(),_std::_Bind<void_(Fifteen::*(Fifteen_*))()>_>::_M_invoke
  ;
  local_e0 = std::_Function_handler<void_(),_std::_Bind<void_(Fifteen::*(Fifteen_*))()>_>::
             _M_manager;
  QVar13.m_data = (storage_type *)0x5;
  QVar13.m_size = (qsizetype)&local_158;
  QString::fromUtf8(QVar13);
  local_178.d.d = (Data *)local_158._M_unused._0_8_;
  local_178.d.ptr = (char16_t *)local_158._8_8_;
  local_178.d.size = (qsizetype)local_148;
  MenuBar::bindSlot(pMVar2,ABOUT,(function<void_()> *)&local_f0,&this->super_QMainWindow,&local_178)
  ;
  if (&(local_178.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_178.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_178.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_178.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_178.d.d)->super_QArrayData,2,8);
    }
  }
  if (local_e0 != (code *)0x0) {
    (*local_e0)(&local_f0,&local_f0,__destroy_functor);
  }
  MenuBar::createMenuBar
            ((this->menuBar)._M_t.super___uniq_ptr_impl<MenuBar,_std::default_delete<MenuBar>_>._M_t
             .super__Tuple_impl<0UL,_MenuBar_*,_std::default_delete<MenuBar>_>.
             super__Head_base<0UL,_MenuBar_*,_false>._M_head_impl,&this->super_QMainWindow);
  QMainWindow::setMenuBar((QMenuBar *)this);
  local_158._8_8_ = 0;
  local_158._M_unused._M_object = operator_new(0x18);
  *(code **)local_158._M_unused._0_8_ = slotGenerateBoard;
  *(undefined8 *)((long)local_158._M_unused._0_8_ + 8) = 0;
  *(Fifteen **)((long)local_158._M_unused._0_8_ + 0x10) = this;
  pcStack_140 = std::_Function_handler<void_(),_std::_Bind<void_(Fifteen::*(Fifteen_*))()>_>::
                _M_invoke;
  local_148 = std::_Function_handler<void_(),_std::_Bind<void_(Fifteen::*(Fifteen_*))()>_>::
              _M_manager;
  local_138 = (undefined8 *)0x0;
  uStack_130 = 0;
  local_128 = (code *)0x0;
  pcStack_120 = (code *)0x0;
  local_138 = (undefined8 *)operator_new(0x18);
  *local_138 = slotSolveBoard;
  local_138[1] = 0;
  local_138[2] = this;
  pcStack_120 = std::_Function_handler<void_(),_std::_Bind<void_(Fifteen::*(Fifteen_*))()>_>::
                _M_invoke;
  local_128 = std::_Function_handler<void_(),_std::_Bind<void_(Fifteen::*(Fifteen_*))()>_>::
              _M_manager;
  local_118._M_unused._M_object = (void *)0x0;
  local_118._8_8_ = 0;
  local_108[0] = (code *)0x0;
  local_108[1] = (code *)0x0;
  local_118._M_unused._M_object = operator_new(0x18);
  *(code **)local_118._M_unused._0_8_ = slotUndoMove;
  *(undefined8 *)((long)local_118._M_unused._0_8_ + 8) = 0;
  *(Fifteen **)((long)local_118._M_unused._0_8_ + 0x10) = this;
  local_108[1] = std::_Function_handler<void_(),_std::_Bind<void_(Fifteen::*(Fifteen_*))()>_>::
                 _M_invoke;
  local_108[0] = std::_Function_handler<void_(),_std::_Bind<void_(Fifteen::*(Fifteen_*))()>_>::
                 _M_manager;
  pQVar3 = Panel::createLayout((this->panel)._M_t.
                               super___uniq_ptr_impl<Panel,_std::default_delete<Panel>_>._M_t.
                               super__Tuple_impl<0UL,_Panel_*,_std::default_delete<Panel>_>.
                               super__Head_base<0UL,_Panel_*,_false>._M_head_impl,
                               (array<std::function<void_()>,_3UL> *)&local_158,
                               &this->super_QMainWindow);
  pQVar4 = (QWidget *)operator_new(0x28);
  QWidget::QWidget(pQVar4,this,0);
  QWidget::setContentsMargins((int)pQVar4,0x14,0x14,0);
  this_02 = (QHBoxLayout *)operator_new(0x20);
  QHBoxLayout::QHBoxLayout(this_02,pQVar4);
  pQVar5 = TilesBoard::createGroupBox
                     ((this->tilesBoard)._M_t.
                      super___uniq_ptr_impl<TilesBoard,_std::default_delete<TilesBoard>_>._M_t.
                      super__Tuple_impl<0UL,_TilesBoard_*,_std::default_delete<TilesBoard>_>.
                      super__Head_base<0UL,_TilesBoard_*,_false>._M_head_impl);
  QBoxLayout::addWidget(this_02,pQVar5,0,0);
  QBoxLayout::addLayout((QLayout *)this_02,(int)pQVar3);
  QMainWindow::setCentralWidget((QWidget *)this);
  createTiles(this);
  setTiles(this);
  lVar7 = -0x60;
  p_Var6 = &local_118;
  do {
    if (*(code **)(p_Var6 + 1) != (code *)0x0) {
      (**(code **)(p_Var6 + 1))(p_Var6,p_Var6,3);
    }
    p_Var6 = p_Var6 + -2;
    lVar7 = lVar7 + 0x20;
  } while (lVar7 != 0);
  return;
}

Assistant:

void Fifteen::initGame()
{
    resize( 850, 600 );
    controller = std::make_unique<Controller>();
    tilesBoard = std::make_unique<TilesBoard>( std::bind( &Fifteen::pressTile, this ));
    panel = std::make_unique<Panel>();

    menuBar = std::make_unique<MenuBar>();
    menuBar->bindSlot( ActionMenu::OPEN_GRAPHIC, std::bind( &Fifteen::slotLoadGraphic, this ), this, "Load Graphic File" );
    menuBar->bindSlot( ActionMenu::REM_GRAPHIC, std::bind( &Fifteen::slotRemoveGraphic, this ), this, "Remove Graphic" );
    menuBar->bindSlot( ActionMenu::SAVE_BOARD, std::bind( &Fifteen::slotSaveBoard, this ), this, "Save Board" );
    menuBar->bindSlot( ActionMenu::LOAD_BOARD, std::bind( &Fifteen::slotReadBoard, this ), this, "Load Board" );
    menuBar->bindSlot( ActionMenu::SETTINGS, std::bind( &Fifteen::slotSettings, this ), this, "Settings" );
    menuBar->bindSlot( ActionMenu::ABOUT, std::bind( &Fifteen::slotAbout, this ), this, "About" );

    QMenuBar* menu = menuBar->createMenuBar( this );
    setMenuBar( menu );

    std::array<std::function<void( void )>, 3> panelSlots =
    {
        std::bind( &Fifteen::slotGenerateBoard, this ),
        std::bind( &Fifteen::slotSolveBoard, this ),
        std::bind( &Fifteen::slotUndoMove, this ),
    };
    QVBoxLayout* layout = panel->createLayout( panelSlots, this );

    QWidget* mainPanel = new QWidget( this );
    mainPanel->setContentsMargins( 20, 20, 0, 20 );

    QHBoxLayout* mainLayout = new QHBoxLayout( mainPanel );
    QGroupBox* boxImages = tilesBoard->createGroupBox();
    mainLayout->addWidget( boxImages );
    mainLayout->addLayout( layout );
    setCentralWidget( mainPanel );

    redrawTiles();
}